

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Film::readFrom(Film *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryReader *in_RSI;
  vec2i *in_RDI;
  
  BinaryReader::read<pbrt::math::vec2i,void>(in_RSI,in_RDI);
  BinaryReader::read(in_RSI,(int)in_RDI + 0x20,__buf,in_RCX);
  return;
}

Assistant:

void Film::readFrom(BinaryReader &binary) 
  {
    binary.read(resolution);
    binary.read(fileName);
  }